

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  uint *puVar1;
  jpeg_marker_reader *pjVar2;
  jpeg_source_mgr *pjVar3;
  ulong uVar4;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var5;
  long lVar6;
  d_derived_tbl *htbl;
  d_derived_tbl *htbl_00;
  bool bVar7;
  boolean bVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  JBLOCKROW paJVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  _func_void_j_decompress_ptr *p_Var23;
  huff_entropy_ptr entropy;
  jpeg_entropy_decoder *pjVar24;
  byte *pbVar25;
  _func_void_j_decompress_ptr *p_Var26;
  bool bVar27;
  savable_state_conflict state;
  savable_state_conflict state_1;
  bitread_working_state local_88;
  jpeg_entropy_decoder *local_60;
  jpeg_entropy_decoder *local_58;
  JBLOCKROW *local_50;
  undefined8 local_48;
  _func_void_j_decompress_ptr *p_Stack_40;
  
  local_50 = MCU_data;
  pjVar24 = cinfo->entropy;
  if (cinfo->restart_interval == 0) {
    bVar27 = true;
  }
  else {
    bVar27 = false;
    if (*(int *)&pjVar24[2].decode_mcu == 0) {
      iVar22 = *(int *)&pjVar24[1].decode_mcu;
      iVar16 = iVar22 + 7;
      if (-1 < iVar22) {
        iVar16 = iVar22;
      }
      pjVar2 = cinfo->marker;
      puVar1 = &pjVar2->discarded_bytes;
      *puVar1 = *puVar1 + (iVar16 >> 3);
      *(undefined4 *)&pjVar24[1].decode_mcu = 0;
      bVar8 = (*pjVar2->read_restart_marker)(cinfo);
      if (bVar8 == 0) {
        return 0;
      }
      if (0 < cinfo->comps_in_scan) {
        lVar11 = 0;
        do {
          (&pjVar24[1].insufficient_data)[lVar11] = 0;
          lVar11 = lVar11 + 1;
        } while (lVar11 < cinfo->comps_in_scan);
      }
      *(uint *)&pjVar24[2].decode_mcu = cinfo->restart_interval;
      if (cinfo->unread_marker == 0) {
        pjVar24->insufficient_data = 0;
      }
      bVar27 = false;
      if (bVar8 == 0) {
        return 0;
      }
    }
  }
  pjVar3 = cinfo->src;
  uVar4 = pjVar3->bytes_in_buffer;
  iVar22 = cinfo->blocks_in_MCU;
  if ((uVar4 < (ulong)((long)iVar22 << 9)) || (cinfo->unread_marker != 0)) {
    bVar27 = false;
  }
  local_58 = pjVar24;
  if (pjVar24->insufficient_data == 0) {
    if (bVar27) {
      pjVar24 = cinfo->entropy;
      pbVar25 = pjVar3->next_input_byte;
      p_Var23 = pjVar24[1].start_pass;
      iVar16 = *(int *)&pjVar24[1].decode_mcu;
      local_88.next_input_byte = *(JOCTET **)&pjVar24[1].insufficient_data;
      local_88.bytes_in_buffer = (size_t)pjVar24[2].start_pass;
      local_60 = (jpeg_entropy_decoder *)pbVar25;
      if (0 < iVar22) {
        lVar11 = 0;
        do {
          if (local_50 == (JBLOCKROW *)0x0) {
            paJVar18 = (JBLOCKROW)0x0;
          }
          else {
            paJVar18 = local_50[lVar11];
          }
          p_Var5 = (&pjVar24[5].decode_mcu)[lVar11];
          lVar6 = *(long *)(&pjVar24[8].insufficient_data + lVar11 * 2);
          iVar9 = iVar16;
          if (iVar16 < 0x11) {
            lVar12 = (ulong)*pbVar25 + (long)p_Var23 * 0x100;
            if ((ulong)*pbVar25 == 0xff) {
              if (pbVar25[1] == 0) {
                pbVar25 = pbVar25 + 2;
              }
              else {
                cinfo->unread_marker = (uint)pbVar25[1];
                lVar12 = (long)p_Var23 * 0x100;
              }
            }
            else {
              pbVar25 = pbVar25 + 1;
            }
            lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
            if ((ulong)*pbVar25 == 0xff) {
              if (pbVar25[1] == 0) {
                pbVar25 = pbVar25 + 2;
              }
              else {
                cinfo->unread_marker = (uint)pbVar25[1];
                lVar14 = lVar12 * 0x100;
              }
            }
            else {
              pbVar25 = pbVar25 + 1;
            }
            lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
            if ((ulong)*pbVar25 == 0xff) {
              if (pbVar25[1] == 0) {
                pbVar25 = pbVar25 + 2;
              }
              else {
                cinfo->unread_marker = (uint)pbVar25[1];
                lVar12 = lVar14 * 0x100;
              }
            }
            else {
              pbVar25 = pbVar25 + 1;
            }
            lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
            if ((ulong)*pbVar25 == 0xff) {
              if (pbVar25[1] == 0) {
                pbVar25 = pbVar25 + 2;
              }
              else {
                cinfo->unread_marker = (uint)pbVar25[1];
                lVar14 = lVar12 * 0x100;
              }
            }
            else {
              pbVar25 = pbVar25 + 1;
            }
            lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
            if ((ulong)*pbVar25 == 0xff) {
              if (pbVar25[1] == 0) {
                pbVar25 = pbVar25 + 2;
              }
              else {
                cinfo->unread_marker = (uint)pbVar25[1];
                lVar12 = lVar14 * 0x100;
              }
            }
            else {
              pbVar25 = pbVar25 + 1;
            }
            p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100) + *pbVar25;
            iVar9 = iVar16 + 0x30;
            if ((ulong)*pbVar25 == 0xff) {
              if (pbVar25[1] == 0) {
                pbVar25 = pbVar25 + 2;
              }
              else {
                cinfo->unread_marker = (uint)pbVar25[1];
                p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100);
              }
            }
            else {
              pbVar25 = pbVar25 + 1;
            }
          }
          uVar21 = *(uint *)(p_Var5 + (ulong)((uint)((ulong)p_Var23 >> ((char)iVar9 - 8U & 0x3f)) &
                                             0xff) * 4 + 0x128);
          uVar17 = (int)uVar21 >> 8;
          iVar16 = iVar9 - uVar17;
          if ((int)uVar17 < 9) {
            uVar21 = uVar21 & 0xff;
          }
          else {
            uVar20 = (uint)((ulong)p_Var23 >> ((byte)iVar16 & 0x3f)) &
                     ~(-1 << ((byte)(uVar21 >> 8) & 0x1f));
            uVar19 = (ulong)uVar20;
            uVar13 = (ulong)uVar17;
            if (*(long *)(p_Var5 + uVar13 * 8) < (long)uVar19) {
              uVar17 = ~uVar17;
              uVar15 = uVar13;
              do {
                uVar20 = (uint)(((ulong)p_Var23 >> ((ulong)(iVar9 + uVar17) & 0x3f) & 1) != 0) +
                         (int)uVar19 * 2;
                uVar19 = (ulong)uVar20;
                uVar13 = uVar15 + 1;
                uVar17 = uVar17 - 1;
                lVar12 = uVar15 * 8;
                uVar15 = uVar13;
              } while (*(long *)(p_Var5 + lVar12 + 8) < (long)(int)uVar20);
              uVar17 = (uint)uVar13;
              iVar16 = iVar9 - uVar17;
            }
            uVar21 = 0;
            if ((int)uVar17 < 0x11) {
              uVar21 = (uint)*(byte *)(*(long *)(p_Var5 + 0x120) + 0x11 +
                                      (ulong)(uVar20 + *(int *)(p_Var5 + uVar13 * 8 + 0x90) & 0xff))
              ;
            }
          }
          if (uVar21 == 0) {
            iVar9 = 0;
          }
          else {
            if (iVar16 < 0x11) {
              lVar12 = (ulong)*pbVar25 + (long)p_Var23 * 0x100;
              if ((ulong)*pbVar25 == 0xff) {
                if (pbVar25[1] == 0) {
                  pbVar25 = pbVar25 + 2;
                }
                else {
                  cinfo->unread_marker = (uint)pbVar25[1];
                  lVar12 = (long)p_Var23 * 0x100;
                }
              }
              else {
                pbVar25 = pbVar25 + 1;
              }
              lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
              if ((ulong)*pbVar25 == 0xff) {
                if (pbVar25[1] == 0) {
                  pbVar25 = pbVar25 + 2;
                }
                else {
                  cinfo->unread_marker = (uint)pbVar25[1];
                  lVar14 = lVar12 * 0x100;
                }
              }
              else {
                pbVar25 = pbVar25 + 1;
              }
              lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
              if ((ulong)*pbVar25 == 0xff) {
                if (pbVar25[1] == 0) {
                  pbVar25 = pbVar25 + 2;
                }
                else {
                  cinfo->unread_marker = (uint)pbVar25[1];
                  lVar12 = lVar14 * 0x100;
                }
              }
              else {
                pbVar25 = pbVar25 + 1;
              }
              lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
              if ((ulong)*pbVar25 == 0xff) {
                if (pbVar25[1] == 0) {
                  pbVar25 = pbVar25 + 2;
                }
                else {
                  cinfo->unread_marker = (uint)pbVar25[1];
                  lVar14 = lVar12 * 0x100;
                }
              }
              else {
                pbVar25 = pbVar25 + 1;
              }
              lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
              if ((ulong)*pbVar25 == 0xff) {
                if (pbVar25[1] == 0) {
                  pbVar25 = pbVar25 + 2;
                }
                else {
                  cinfo->unread_marker = (uint)pbVar25[1];
                  lVar12 = lVar14 * 0x100;
                }
              }
              else {
                pbVar25 = pbVar25 + 1;
              }
              p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100) + *pbVar25;
              iVar16 = iVar16 + 0x30;
              if ((ulong)*pbVar25 == 0xff) {
                if (pbVar25[1] == 0) {
                  pbVar25 = pbVar25 + 2;
                }
                else {
                  cinfo->unread_marker = (uint)pbVar25[1];
                  p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100);
                }
              }
              else {
                pbVar25 = pbVar25 + 1;
              }
            }
            iVar16 = iVar16 - uVar21;
            uVar17 = -1 << ((byte)uVar21 & 0x1f);
            uVar20 = ~uVar17 & (uint)((ulong)p_Var23 >> ((byte)iVar16 & 0x3f));
            iVar9 = ((int)((-1 << ((byte)uVar21 - 1 & 0x1f)) + uVar20) >> 0x1f & uVar17 + 1) +
                    uVar20;
          }
          if (*(int *)((long)&pjVar24[0xc].start_pass + lVar11 * 4) != 0) {
            iVar9 = iVar9 + *(int *)((long)&local_88.next_input_byte +
                                    (long)cinfo->MCU_membership[lVar11] * 4);
            *(int *)((long)&local_88.next_input_byte + (long)cinfo->MCU_membership[lVar11] * 4) =
                 iVar9;
            if (paJVar18 != (JBLOCKROW)0x0) {
              (*paJVar18)[0] = (JCOEF)iVar9;
            }
          }
          if (((&pjVar24[0xd].insufficient_data)[lVar11] == 0) || (paJVar18 == (JBLOCKROW)0x0)) {
            iVar9 = 1;
            do {
              if (iVar16 < 0x11) {
                lVar12 = (ulong)*pbVar25 + (long)p_Var23 * 0x100;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar12 = (long)p_Var23 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar14 = lVar12 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar12 = lVar14 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar14 = lVar12 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar12 = lVar14 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100) + *pbVar25;
                iVar16 = iVar16 + 0x30;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100);
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
              }
              uVar21 = *(uint *)(lVar6 + 0x128 +
                                (ulong)((uint)((ulong)p_Var23 >> ((char)iVar16 - 8U & 0x3f)) & 0xff)
                                * 4);
              uVar17 = (int)uVar21 >> 8;
              iVar10 = iVar16 - uVar17;
              if ((int)uVar17 < 9) {
                uVar21 = uVar21 & 0xff;
                iVar16 = iVar10;
              }
              else {
                uVar20 = (uint)((ulong)p_Var23 >> ((byte)iVar10 & 0x3f)) &
                         ~(-1 << ((byte)(uVar21 >> 8) & 0x1f));
                uVar19 = (ulong)uVar20;
                uVar13 = (ulong)uVar17;
                if (*(long *)(lVar6 + uVar13 * 8) < (long)uVar19) {
                  uVar17 = ~uVar17;
                  uVar15 = uVar13;
                  do {
                    uVar20 = (uint)(((ulong)p_Var23 >> ((ulong)(iVar16 + uVar17) & 0x3f) & 1) != 0)
                             + (int)uVar19 * 2;
                    uVar19 = (ulong)uVar20;
                    uVar13 = uVar15 + 1;
                    uVar17 = uVar17 - 1;
                    lVar12 = uVar15 * 8;
                    uVar15 = uVar13;
                  } while (*(long *)(lVar6 + 8 + lVar12) < (long)(int)uVar20);
                  uVar17 = (uint)uVar13;
                  iVar10 = iVar16 - uVar17;
                }
                uVar21 = 0;
                iVar16 = iVar10;
                if ((int)uVar17 < 0x11) {
                  uVar21 = (uint)*(byte *)(*(long *)(lVar6 + 0x120) + 0x11 +
                                          ((ulong)(uVar20 + *(int *)(lVar6 + 0x90 + uVar13 * 8)) &
                                          0xff));
                }
              }
              uVar17 = uVar21 >> 4;
              if ((uVar21 & 0xf) == 0) {
                bVar27 = uVar17 != 0xf;
                uVar17 = 0xf;
                if (bVar27) break;
              }
              else {
                if (iVar16 < 0x11) {
                  lVar12 = (ulong)*pbVar25 + (long)p_Var23 * 0x100;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar12 = (long)p_Var23 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar14 = lVar12 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar12 = lVar14 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar14 = lVar12 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar12 = lVar14 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100) + *pbVar25;
                  iVar16 = iVar16 + 0x30;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100);
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                }
                iVar16 = iVar16 - (uVar21 & 0xf);
              }
              iVar9 = iVar9 + uVar17 + 1;
            } while (iVar9 < 0x40);
          }
          else {
            iVar9 = 1;
            do {
              if (iVar16 < 0x11) {
                lVar12 = (ulong)*pbVar25 + (long)p_Var23 * 0x100;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar12 = (long)p_Var23 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar14 = lVar12 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar12 = lVar14 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar14 = lVar12 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    lVar12 = lVar14 * 0x100;
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
                p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100) + *pbVar25;
                iVar16 = iVar16 + 0x30;
                if ((ulong)*pbVar25 == 0xff) {
                  if (pbVar25[1] == 0) {
                    pbVar25 = pbVar25 + 2;
                  }
                  else {
                    cinfo->unread_marker = (uint)pbVar25[1];
                    p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100);
                  }
                }
                else {
                  pbVar25 = pbVar25 + 1;
                }
              }
              uVar21 = *(uint *)(lVar6 + 0x128 +
                                (ulong)((uint)((ulong)p_Var23 >> ((char)iVar16 - 8U & 0x3f)) & 0xff)
                                * 4);
              uVar17 = (int)uVar21 >> 8;
              iVar10 = iVar16 - uVar17;
              if ((int)uVar17 < 9) {
                uVar21 = uVar21 & 0xff;
                iVar16 = iVar10;
              }
              else {
                uVar20 = (uint)((ulong)p_Var23 >> ((byte)iVar10 & 0x3f)) &
                         ~(-1 << ((byte)(uVar21 >> 8) & 0x1f));
                uVar19 = (ulong)uVar20;
                uVar13 = (ulong)uVar17;
                if (*(long *)(lVar6 + uVar13 * 8) < (long)uVar19) {
                  uVar17 = ~uVar17;
                  uVar15 = uVar13;
                  do {
                    uVar20 = (uint)(((ulong)p_Var23 >> ((ulong)(iVar16 + uVar17) & 0x3f) & 1) != 0)
                             + (int)uVar19 * 2;
                    uVar19 = (ulong)uVar20;
                    uVar13 = uVar15 + 1;
                    uVar17 = uVar17 - 1;
                    lVar12 = uVar15 * 8;
                    uVar15 = uVar13;
                  } while (*(long *)(lVar6 + 8 + lVar12) < (long)(int)uVar20);
                  uVar17 = (uint)uVar13;
                  iVar10 = iVar16 - uVar17;
                }
                uVar21 = 0;
                iVar16 = iVar10;
                if ((int)uVar17 < 0x11) {
                  uVar21 = (uint)*(byte *)(*(long *)(lVar6 + 0x120) + 0x11 +
                                          (ulong)(uVar20 + *(int *)(lVar6 + 0x90 + uVar13 * 8) &
                                                 0xff));
                }
              }
              uVar17 = uVar21 & 0xf;
              if (uVar17 == 0) {
                if (uVar21 >> 4 != 0xf) break;
                iVar10 = iVar9 + 0xf;
              }
              else {
                if (iVar16 < 0x11) {
                  lVar12 = (ulong)*pbVar25 + (long)p_Var23 * 0x100;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar12 = (long)p_Var23 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar14 = lVar12 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar12 = lVar14 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  lVar14 = lVar12 * 0x100 + (ulong)*pbVar25;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar14 = lVar12 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  lVar12 = lVar14 * 0x100 + (ulong)*pbVar25;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      lVar12 = lVar14 * 0x100;
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                  p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100) + *pbVar25;
                  iVar16 = iVar16 + 0x30;
                  if ((ulong)*pbVar25 == 0xff) {
                    if (pbVar25[1] == 0) {
                      pbVar25 = pbVar25 + 2;
                    }
                    else {
                      cinfo->unread_marker = (uint)pbVar25[1];
                      p_Var23 = (_func_void_j_decompress_ptr *)(lVar12 * 0x100);
                    }
                  }
                  else {
                    pbVar25 = pbVar25 + 1;
                  }
                }
                iVar16 = iVar16 - uVar17;
                iVar10 = (uVar21 >> 4) + iVar9;
                uVar21 = -1 << (sbyte)uVar17;
                uVar20 = ~uVar21 & (uint)((ulong)p_Var23 >> ((byte)iVar16 & 0x3f));
                (*paJVar18)[jpeg_natural_order[iVar10]] =
                     ((ushort)((int)((-1 << ((sbyte)uVar17 - 1U & 0x1f)) + uVar20) >> 0x1f) &
                     ((ushort)uVar21 | 1)) + (short)uVar20;
              }
              iVar9 = iVar10 + 1;
            } while (iVar10 < 0x3f);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != iVar22);
      }
      if (cinfo->unread_marker == 0) {
        pjVar3->next_input_byte = pbVar25;
        pjVar3->bytes_in_buffer = (size_t)((long)local_60 + (uVar4 - (long)pbVar25));
        pjVar24[1].start_pass = p_Var23;
        *(int *)&pjVar24[1].decode_mcu = iVar16;
        *(JOCTET **)&pjVar24[1].insufficient_data = local_88.next_input_byte;
        pjVar24[2].start_pass = (_func_void_j_decompress_ptr *)local_88.bytes_in_buffer;
        goto LAB_0011cc69;
      }
      cinfo->unread_marker = 0;
    }
    local_60 = cinfo->entropy;
    local_88.cinfo = cinfo;
    local_88.next_input_byte = cinfo->src->next_input_byte;
    local_88.bytes_in_buffer = cinfo->src->bytes_in_buffer;
    p_Var23 = local_60[1].start_pass;
    iVar22 = *(int *)&local_60[1].decode_mcu;
    local_48 = *(undefined8 *)&local_60[1].insufficient_data;
    p_Stack_40 = local_60[2].start_pass;
    if (0 < cinfo->blocks_in_MCU) {
      lVar11 = 0;
      pjVar24 = local_58;
LAB_0011c7ff:
      if (local_50 == (JBLOCKROW *)0x0) {
        paJVar18 = (JBLOCKROW)0x0;
      }
      else {
        paJVar18 = local_50[lVar11];
      }
      htbl = (d_derived_tbl *)(&local_60[5].decode_mcu)[lVar11];
      htbl_00 = *(d_derived_tbl **)(&local_60[8].insufficient_data + lVar11 * 2);
      if (iVar22 < 8) {
        bVar27 = false;
        bVar8 = jpeg_fill_bit_buffer(&local_88,(bit_buf_type)p_Var23,iVar22,0);
        if (bVar8 != 0) {
          iVar16 = 1;
          p_Var23 = (_func_void_j_decompress_ptr *)local_88.get_buffer;
          iVar22 = local_88.bits_left;
          if (7 < local_88.bits_left) goto LAB_0011c871;
          goto LAB_0011c8a4;
        }
      }
      else {
LAB_0011c871:
        uVar21 = htbl->lookup[(ulong)p_Var23 >> ((char)iVar22 - 8U & 0x3f) & 0xff];
        iVar16 = (int)uVar21 >> 8;
        if (iVar16 < 9) {
          pjVar24 = (jpeg_entropy_decoder *)(ulong)(uVar21 & 0xff);
          bVar27 = true;
          iVar22 = iVar22 - iVar16;
        }
        else {
LAB_0011c8a4:
          uVar21 = jpeg_huff_decode(&local_88,(bit_buf_type)p_Var23,iVar22,htbl,iVar16);
          if ((int)uVar21 < 0) {
            pjVar24 = (jpeg_entropy_decoder *)0xffffffff;
            bVar27 = false;
          }
          else {
            pjVar24 = (jpeg_entropy_decoder *)(ulong)uVar21;
            bVar27 = true;
            p_Var23 = (_func_void_j_decompress_ptr *)local_88.get_buffer;
            iVar22 = local_88.bits_left;
          }
        }
      }
      bVar7 = false;
      if (bVar27) {
        iVar16 = (int)pjVar24;
        if (iVar16 == 0) {
          pjVar24 = (jpeg_entropy_decoder *)0x0;
        }
        else {
          p_Var26 = p_Var23;
          iVar9 = iVar22;
          if ((iVar22 < iVar16) &&
             (bVar8 = jpeg_fill_bit_buffer(&local_88,(bit_buf_type)p_Var23,iVar22,iVar16),
             p_Var26 = (_func_void_j_decompress_ptr *)local_88.get_buffer,
             iVar9 = local_88.bits_left, bVar8 == 0)) {
            bVar7 = false;
            goto LAB_0011cc19;
          }
          iVar22 = iVar9 - iVar16;
          uVar21 = -1 << ((byte)pjVar24 & 0x1f);
          uVar17 = ~uVar21 & (uint)((ulong)p_Var26 >> ((byte)iVar22 & 0x3f));
          pjVar24 = (jpeg_entropy_decoder *)
                    (ulong)(((int)((-1 << ((byte)pjVar24 - 1 & 0x1f)) + uVar17) >> 0x1f & uVar21 + 1
                            ) + uVar17);
          p_Var23 = p_Var26;
        }
        if (*(int *)((long)&local_60[0xc].start_pass + lVar11 * 4) != 0) {
          uVar21 = (int)pjVar24 +
                   *(int *)((long)&local_48 + (long)cinfo->MCU_membership[lVar11] * 4);
          pjVar24 = (jpeg_entropy_decoder *)(ulong)uVar21;
          *(uint *)((long)&local_48 + (long)cinfo->MCU_membership[lVar11] * 4) = uVar21;
          if (paJVar18 != (JBLOCKROW)0x0) {
            (*paJVar18)[0] = (JCOEF)uVar21;
          }
        }
        if (((&local_60[0xd].insufficient_data)[lVar11] == 0) || (paJVar18 == (JBLOCKROW)0x0)) {
          iVar16 = 1;
          do {
            if (iVar22 < 8) {
              bVar27 = false;
              bVar8 = jpeg_fill_bit_buffer(&local_88,(bit_buf_type)p_Var23,iVar22,0);
              if (bVar8 != 0) {
                iVar9 = 1;
                p_Var23 = (_func_void_j_decompress_ptr *)local_88.get_buffer;
                iVar22 = local_88.bits_left;
                if (7 < local_88.bits_left) goto LAB_0011cb4c;
                goto LAB_0011cb7e;
              }
            }
            else {
LAB_0011cb4c:
              iVar9 = htbl_00->lookup[(ulong)p_Var23 >> ((char)iVar22 - 8U & 0x3f) & 0xff] >> 8;
              if (iVar9 < 9) {
                pjVar24 = (jpeg_entropy_decoder *)
                          (ulong)(byte)htbl_00->lookup
                                       [(ulong)p_Var23 >> ((char)iVar22 - 8U & 0x3f) & 0xff];
                bVar27 = true;
                iVar22 = iVar22 - iVar9;
              }
              else {
LAB_0011cb7e:
                uVar21 = jpeg_huff_decode(&local_88,(bit_buf_type)p_Var23,iVar22,htbl_00,iVar9);
                if ((int)uVar21 < 0) {
                  pjVar24 = (jpeg_entropy_decoder *)0xffffffff;
                  bVar27 = false;
                }
                else {
                  pjVar24 = (jpeg_entropy_decoder *)(ulong)uVar21;
                  bVar27 = true;
                  p_Var23 = (_func_void_j_decompress_ptr *)local_88.get_buffer;
                  iVar22 = local_88.bits_left;
                }
              }
            }
            if (!bVar27) goto LAB_0011cc0b;
            iVar9 = (int)(uint)pjVar24 >> 4;
            uVar4 = (ulong)pjVar24 & 0xf;
            uVar21 = (uint)pjVar24 & 0xf;
            pjVar24 = (jpeg_entropy_decoder *)(ulong)uVar21;
            if (uVar4 == 0) {
              if (iVar9 != 0xf) goto LAB_0011cc0f;
              iVar9 = 0xf;
            }
            else {
              p_Var26 = p_Var23;
              iVar10 = iVar22;
              if ((iVar22 < (int)uVar21) &&
                 (bVar8 = jpeg_fill_bit_buffer(&local_88,(bit_buf_type)p_Var23,iVar22,uVar21),
                 p_Var26 = (_func_void_j_decompress_ptr *)local_88.get_buffer,
                 iVar10 = local_88.bits_left, bVar8 == 0)) goto LAB_0011cc0b;
              iVar22 = iVar10 - uVar21;
              p_Var23 = p_Var26;
            }
            iVar16 = iVar16 + iVar9 + 1;
          } while (iVar16 < 0x40);
        }
        else {
          iVar16 = 1;
          do {
            if (iVar22 < 8) {
              bVar27 = false;
              bVar8 = jpeg_fill_bit_buffer(&local_88,(bit_buf_type)p_Var23,iVar22,0);
              if (bVar8 != 0) {
                iVar9 = 1;
                p_Var23 = (_func_void_j_decompress_ptr *)local_88.get_buffer;
                iVar22 = local_88.bits_left;
                if (7 < local_88.bits_left) goto LAB_0011c9e8;
                goto LAB_0011ca1a;
              }
            }
            else {
LAB_0011c9e8:
              iVar9 = htbl_00->lookup[(ulong)p_Var23 >> ((char)iVar22 - 8U & 0x3f) & 0xff] >> 8;
              if (iVar9 < 9) {
                pjVar24 = (jpeg_entropy_decoder *)
                          (ulong)(byte)htbl_00->lookup
                                       [(ulong)p_Var23 >> ((char)iVar22 - 8U & 0x3f) & 0xff];
                bVar27 = true;
                iVar22 = iVar22 - iVar9;
              }
              else {
LAB_0011ca1a:
                uVar21 = jpeg_huff_decode(&local_88,(bit_buf_type)p_Var23,iVar22,htbl_00,iVar9);
                if ((int)uVar21 < 0) {
                  pjVar24 = (jpeg_entropy_decoder *)0xffffffff;
                  bVar27 = false;
                }
                else {
                  pjVar24 = (jpeg_entropy_decoder *)(ulong)uVar21;
                  bVar27 = true;
                  p_Var23 = (_func_void_j_decompress_ptr *)local_88.get_buffer;
                  iVar22 = local_88.bits_left;
                }
              }
            }
            if (!bVar27) goto LAB_0011cc0b;
            iVar9 = (int)(uint)pjVar24 >> 4;
            uVar4 = (ulong)pjVar24 & 0xf;
            uVar21 = (uint)pjVar24 & 0xf;
            pjVar24 = (jpeg_entropy_decoder *)(ulong)uVar21;
            if (uVar4 == 0) {
              if (iVar9 != 0xf) goto LAB_0011cc0f;
              iVar9 = iVar16 + 0xf;
              pjVar24 = (jpeg_entropy_decoder *)0x0;
            }
            else {
              p_Var26 = p_Var23;
              iVar10 = iVar22;
              if ((iVar22 < (int)uVar21) &&
                 (bVar8 = jpeg_fill_bit_buffer(&local_88,(bit_buf_type)p_Var23,iVar22,uVar21),
                 p_Var26 = (_func_void_j_decompress_ptr *)local_88.get_buffer,
                 iVar10 = local_88.bits_left, bVar8 == 0)) goto LAB_0011cc0b;
              iVar22 = iVar10 - uVar21;
              iVar9 = iVar9 + iVar16;
              uVar17 = -1 << (sbyte)uVar21;
              uVar20 = ~uVar17 & (uint)((ulong)p_Var26 >> ((byte)iVar22 & 0x3f));
              uVar20 = ((int)((-1 << ((sbyte)uVar21 - 1U & 0x1f)) + uVar20) >> 0x1f & (uVar17 | 1))
                       + uVar20;
              pjVar24 = (jpeg_entropy_decoder *)(ulong)uVar20;
              (*paJVar18)[jpeg_natural_order[iVar9]] = (JCOEF)uVar20;
              p_Var23 = p_Var26;
            }
            iVar16 = iVar9 + 1;
          } while (iVar9 < 0x3f);
        }
        bVar7 = true;
      }
      goto LAB_0011cc19;
    }
LAB_0011cc36:
    pjVar3 = cinfo->src;
    pjVar3->next_input_byte = local_88.next_input_byte;
    pjVar3->bytes_in_buffer = local_88.bytes_in_buffer;
    local_60[1].start_pass = p_Var23;
    *(int *)&local_60[1].decode_mcu = iVar22;
    *(undefined8 *)&local_60[1].insufficient_data = local_48;
    local_60[2].start_pass = p_Stack_40;
  }
LAB_0011cc69:
  if (cinfo->restart_interval != 0) {
    *(int *)&local_58[2].decode_mcu = *(int *)&local_58[2].decode_mcu + -1;
  }
  return 1;
LAB_0011cc0f:
  bVar7 = true;
  pjVar24 = (jpeg_entropy_decoder *)0x0;
  goto LAB_0011cc19;
LAB_0011cc0b:
  bVar7 = false;
LAB_0011cc19:
  if (!bVar7) {
    return 0;
  }
  lVar11 = lVar11 + 1;
  if (cinfo->blocks_in_MCU <= lVar11) goto LAB_0011cc36;
  goto LAB_0011c7ff;
}

Assistant:

METHODDEF(boolean)
decode_mcu(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data ? MCU_data[blkn] : NULL;
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2;  st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        st = entropy->dc_stats[tbl] + 20;       /* Table F.4: X1 = 20 */
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;               /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
        entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      entropy->last_dc_val[ci] = (entropy->last_dc_val[ci] + v) & 0xffff;
    }

    if (block)
      (*block)[0] = (JCOEF)entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    tbl = compptr->ac_tbl_no;

    /* Figure F.20: Decode_AC_coefficients */
    for (k = 1; k <= DCTSIZE2 - 1; k++) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      if (arith_decode(cinfo, st)) break;       /* EOB flag */
      while (arith_decode(cinfo, st + 1) == 0) {
        st += 3;  k++;
        if (k > DCTSIZE2 - 1) {
          WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
          entropy->ct = -1;                     /* spectral overflow */
          return TRUE;
        }
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        if (arith_decode(cinfo, st)) {
          m <<= 1;
          st = entropy->ac_stats[tbl] +
               (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
          while (arith_decode(cinfo, st)) {
            if ((m <<= 1) == 0x8000) {
              WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
              entropy->ct = -1;                 /* magnitude overflow */
              return TRUE;
            }
            st += 1;
          }
        }
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      if (block)
        (*block)[jpeg_natural_order[k]] = (JCOEF)v;
    }
  }

  return TRUE;
}